

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O1

bool __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
eqParticles_<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ParticleRef,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ParticleRef>
          (BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *this,ParticleRef a,ParticleRef b
          )

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPVar4;
  int d;
  long lVar5;
  long lVar6;
  MomentumType local_58;
  MomentumType local_38;
  
  local_58.x = 0.0;
  local_58.y = 0.0;
  lVar5 = 0;
  pPVar4 = a.super_ConstParticleRef.particles;
  do {
    (&local_58.x)[lVar5] =
         pPVar4->positions[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[a.super_ConstParticleRef.idx];
    dVar3 = local_58.y;
    dVar2 = local_58.x;
    lVar5 = lVar5 + 1;
    pPVar4 = (ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *)(pPVar4->positions + 1);
  } while (lVar5 == 1);
  local_58.x = 0.0;
  local_58.y = 0.0;
  lVar5 = 0;
  pPVar4 = b.super_ConstParticleRef.particles;
  do {
    (&local_58.x)[lVar5] =
         pPVar4->positions[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[b.super_ConstParticleRef.idx];
    lVar5 = lVar5 + 1;
    pPVar4 = (ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *)(pPVar4->positions + 1);
  } while (lVar5 == 1);
  if ((dVar2 == local_58.x) && (!NAN(dVar2) && !NAN(local_58.x))) {
    if ((dVar3 == local_58.y) && (!NAN(dVar3) && !NAN(local_58.y))) {
      pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMomentum
                (&local_58,&a.super_ConstParticleRef);
      pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMomentum
                (&local_38,&b.super_ConstParticleRef);
      if ((local_58.x == local_38.x) && (!NAN(local_58.x) && !NAN(local_38.x))) {
        if ((local_58.y == local_38.y) && (!NAN(local_58.y) && !NAN(local_38.y))) {
          if ((local_58.z == local_38.z) && (!NAN(local_58.z) && !NAN(local_38.z))) {
            lVar5 = (long)((a.super_ConstParticleRef.particles)->typeIndex).
                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start[a.super_ConstParticleRef.idx] * 0x10;
            dVar2 = *(double *)(pica::ParticleTypes::types + lVar5);
            lVar6 = (long)((b.super_ConstParticleRef.particles)->typeIndex).
                          super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start[b.super_ConstParticleRef.idx] * 0x10;
            pdVar1 = (double *)(pica::ParticleTypes::types + lVar6);
            if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
              dVar2 = *(double *)(pica::ParticleTypes::types + 8 + lVar5);
              pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar6);
              if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
                return (bool)(-(((b.super_ConstParticleRef.particles)->factors).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[b.super_ConstParticleRef.idx] ==
                               ((a.super_ConstParticleRef.particles)->factors).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[a.super_ConstParticleRef.idx]) & 1);
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool eqParticles_(ConstParticleRef1 a, ConstParticleRef2 b) const
    {
        return (a.getPosition() == b.getPosition()) &&
            (a.getMomentum() == b.getMomentum()) &&
            (a.getMass() == b.getMass()) &&
            (a.getCharge() == b.getCharge()) &&
            (a.getFactor() == b.getFactor());
    }